

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_impl.hpp
# Opt level: O2

int64_t duckdb_jaro_winkler::detail::
        jaro_bounds<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,char_const*>
                  (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   P_first,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *P_last,char *T_first,char **T_last)

{
  int64_t iVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = (long)P_last->_M_current - (long)P_first._M_current;
  lVar2 = (long)*T_last - (long)T_first;
  if (lVar3 < lVar2) {
    iVar1 = lVar2 / 2 + -1;
    if (lVar2 / 2 + lVar3 + -1 < lVar2) {
      *T_last = T_first + iVar1 + lVar3;
      return iVar1;
    }
  }
  else {
    iVar1 = lVar3 / 2 + -1;
    if (lVar3 / 2 + lVar2 + -1 < lVar3) {
      P_last->_M_current = P_first._M_current + iVar1 + lVar2;
    }
  }
  return iVar1;
}

Assistant:

int64_t jaro_bounds(InputIt1 P_first, InputIt1& P_last, InputIt2 T_first, InputIt2& T_last)
{
    int64_t P_len = std::distance(P_first, P_last);
    int64_t T_len = std::distance(T_first, T_last);

    /* since jaro uses a sliding window some parts of T/P might never be in
     * range an can be removed ahead of time
     */
    int64_t Bound = 0;
    if (T_len > P_len) {
        Bound = T_len / 2 - 1;
        if (T_len > P_len + Bound) {
            T_last = T_first + P_len + Bound;
        }
    }
    else {
        Bound = P_len / 2 - 1;
        if (P_len > T_len + Bound) {
            P_last = P_first + T_len + Bound;
        }
    }
    return Bound;
}